

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O2

bool tinyusdz::IsUSD(uint8_t *addr,size_t length,string *detected_format)

{
  bool bVar1;
  
  bVar1 = IsUSDA(addr,length);
  if (((bVar1) || (bVar1 = IsUSDC(addr,length), bVar1)) || (bVar1 = IsUSDZ(addr,length), bVar1)) {
    if (detected_format != (string *)0x0) {
      ::std::__cxx11::string::assign((char *)detected_format);
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsUSD(const uint8_t *addr, const size_t length, std::string *detected_format) {
  if (IsUSDA(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}